

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryVkImpl.cpp
# Opt level: O0

bool Diligent::anon_unknown_60::GetStatisticsQueryData
               (VulkanLogicalDevice *LogicalDevice,VkQueryPool vkQueryPool,Uint32 QueryIdx,
               HardwareQueueIndex QueueFamilyIndex,void *pData,Uint32 DataSize)

{
  size_type sVar1;
  VkPipelineStageFlags VVar2;
  Char *Message;
  reference pvVar3;
  array<unsigned_long,_12UL> *Results_00;
  bool local_f1;
  size_type local_e8;
  size_t Idx;
  undefined1 local_d0 [8];
  string msg;
  QueryDataPipelineStatistics *QueryData;
  bool local_99;
  VkPipelineStageFlags StageMask;
  bool DataAvailable;
  array<unsigned_long,_12UL> Results;
  Uint32 DataSize_local;
  void *pData_local;
  Uint32 QueryIdx_local;
  VkQueryPool vkQueryPool_local;
  VulkanLogicalDevice *LogicalDevice_local;
  HardwareQueueIndex QueueFamilyIndex_local;
  
  Results._M_elems[0xb]._4_4_ = DataSize;
  memset(&StageMask,0,0x60);
  Results_00 = (array<unsigned_long,_12UL> *)&StageMask;
  local_99 = (anonymous_namespace)::GetQueryResults<12ul>
                       (LogicalDevice,vkQueryPool,QueryIdx,Results_00);
  if ((local_99) && (pData != (void *)0x0)) {
    VVar2 = VulkanUtilities::VulkanLogicalDevice::GetSupportedStagesMask
                      (LogicalDevice,QueueFamilyIndex);
    msg.field_2._8_8_ = pData;
    if (Results._M_elems[0xb]._4_4_ != 0x60) {
      FormatString<char[26],char[30]>
                ((string *)local_d0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DataSize == sizeof(QueryData)",(char (*) [30])Results_00);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GetStatisticsQueryData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
                 ,0x125);
      std::__cxx11::string::~string((string *)local_d0);
    }
    pvVar3 = std::array<unsigned_long,_12UL>::operator[]((array<unsigned_long,_12UL> *)&StageMask,0)
    ;
    *(value_type_conflict2 *)(msg.field_2._8_8_ + 8) = *pvVar3;
    pvVar3 = std::array<unsigned_long,_12UL>::operator[]((array<unsigned_long,_12UL> *)&StageMask,1)
    ;
    *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x10) = *pvVar3;
    local_e8 = 3;
    pvVar3 = std::array<unsigned_long,_12UL>::operator[]((array<unsigned_long,_12UL> *)&StageMask,2)
    ;
    *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x30) = *pvVar3;
    if ((VVar2 & 0x40) != 0) {
      pvVar3 = std::array<unsigned_long,_12UL>::operator[]
                         ((array<unsigned_long,_12UL> *)&StageMask,3);
      *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x38) = *pvVar3;
      local_e8 = 5;
      pvVar3 = std::array<unsigned_long,_12UL>::operator[]
                         ((array<unsigned_long,_12UL> *)&StageMask,4);
      *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x18) = *pvVar3;
    }
    pvVar3 = std::array<unsigned_long,_12UL>::operator[]
                       ((array<unsigned_long,_12UL> *)&StageMask,local_e8);
    *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x20) = *pvVar3;
    pvVar3 = std::array<unsigned_long,_12UL>::operator[]
                       ((array<unsigned_long,_12UL> *)&StageMask,local_e8 + 1);
    *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x28) = *pvVar3;
    pvVar3 = std::array<unsigned_long,_12UL>::operator[]
                       ((array<unsigned_long,_12UL> *)&StageMask,local_e8 + 2);
    *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x40) = *pvVar3;
    sVar1 = local_e8 + 3;
    if ((VVar2 & 0x10) != 0) {
      pvVar3 = std::array<unsigned_long,_12UL>::operator[]
                         ((array<unsigned_long,_12UL> *)&StageMask,local_e8 + 3);
      *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x48) = *pvVar3;
      sVar1 = local_e8 + 4;
    }
    local_e8 = sVar1;
    if ((VVar2 & 0x20) != 0) {
      pvVar3 = std::array<unsigned_long,_12UL>::operator[]
                         ((array<unsigned_long,_12UL> *)&StageMask,local_e8);
      *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x50) = *pvVar3;
      local_e8 = local_e8 + 1;
    }
    pvVar3 = std::array<unsigned_long,_12UL>::operator[]
                       ((array<unsigned_long,_12UL> *)&StageMask,local_e8);
    *(value_type_conflict2 *)(msg.field_2._8_8_ + 0x58) = *pvVar3;
    local_f1 = false;
    if (local_99) {
      pvVar3 = std::array<unsigned_long,_12UL>::operator[]
                         ((array<unsigned_long,_12UL> *)&StageMask,local_e8 + 1);
      local_f1 = *pvVar3 != 0;
    }
    local_99 = local_f1;
  }
  return local_99;
}

Assistant:

inline bool GetStatisticsQueryData(const VulkanUtilities::VulkanLogicalDevice& LogicalDevice,
                                   VkQueryPool                                 vkQueryPool,
                                   Uint32                                      QueryIdx,
                                   HardwareQueueIndex                          QueueFamilyIndex,
                                   void*                                       pData,
                                   Uint32                                      DataSize)
{
    // Pipeline statistics queries write one integer value for each bit that is enabled in the
    // pipelineStatistics when the pool is created, and the statistics values are written in bit
    // order starting from the least significant bit. (17.2)

    std::array<Uint64, 12> Results{};

    auto DataAvailable = GetQueryResults(LogicalDevice, vkQueryPool, QueryIdx, Results);
    if (DataAvailable && pData != nullptr)
    {
        const auto StageMask = LogicalDevice.GetSupportedStagesMask(QueueFamilyIndex);

        auto& QueryData = *reinterpret_cast<QueryDataPipelineStatistics*>(pData);
        VERIFY_EXPR(DataSize == sizeof(QueryData));

        size_t Idx = 0;

        QueryData.InputVertices   = Results[Idx++]; // INPUT_ASSEMBLY_VERTICES_BIT   = 0x00000001
        QueryData.InputPrimitives = Results[Idx++]; // INPUT_ASSEMBLY_PRIMITIVES_BIT = 0x00000002
        QueryData.VSInvocations   = Results[Idx++]; // VERTEX_SHADER_INVOCATIONS_BIT = 0x00000004
        if (StageMask & VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT)
        {
            QueryData.GSInvocations = Results[Idx++]; // GEOMETRY_SHADER_INVOCATIONS_BIT = 0x00000008
            QueryData.GSPrimitives  = Results[Idx++]; // GEOMETRY_SHADER_PRIMITIVES_BIT  = 0x00000010
        }
        QueryData.ClippingInvocations = Results[Idx++]; // CLIPPING_INVOCATIONS_BIT         = 0x00000020
        QueryData.ClippingPrimitives  = Results[Idx++]; // CLIPPING_PRIMITIVES_BIT          = 0x00000040
        QueryData.PSInvocations       = Results[Idx++]; // FRAGMENT_SHADER_INVOCATIONS_BIT  = 0x00000080

        if (StageMask & VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT)
            QueryData.HSInvocations = Results[Idx++]; // TESSELLATION_CONTROL_SHADER_PATCHES_BIT        = 0x00000100

        if (StageMask & VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT)
            QueryData.DSInvocations = Results[Idx++]; // TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT = 0x00000200

        QueryData.CSInvocations = Results[Idx++]; // COMPUTE_SHADER_INVOCATIONS_BIT = 0x00000400

        DataAvailable = DataAvailable && (Results[Idx] != 0);
    }

    return DataAvailable;
}